

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IColourImpl * Catch::anon_unknown_1::platformColourInstance(void)

{
  bool bVar1;
  IContext *pIVar2;
  element_type *peVar3;
  YesOrNo colourMode;
  IConfigPtr config;
  ErrnoGuard guard;
  shared_ptr<const_Catch::IConfig> *in_stack_ffffffffffffff98;
  IColourImpl *in_stack_ffffffffffffffa0;
  IColourImpl *local_58;
  int local_40;
  int local_28;
  __shared_ptr local_18 [24];
  
  ErrnoGuard::ErrnoGuard((ErrnoGuard *)in_stack_ffffffffffffffa0);
  pIVar2 = getCurrentContext();
  (*pIVar2->_vptr_IContext[4])();
  clara::std::shared_ptr<const_Catch::IConfig>::shared_ptr
            ((shared_ptr<const_Catch::IConfig> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98
            );
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_18);
  if (bVar1) {
    peVar3 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x125078);
    local_40 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[0x12])();
  }
  else {
    local_40 = 0;
  }
  local_28 = local_40;
  if (local_40 == 0) {
    bVar1 = useColourOnPlatform();
    local_28 = 2;
    if (bVar1) {
      local_28 = 1;
    }
  }
  if (local_28 == 1) {
    local_58 = PosixColourImpl::instance();
  }
  else {
    in_stack_ffffffffffffffa0 = NoColourImpl::instance();
    local_58 = in_stack_ffffffffffffffa0;
  }
  clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr
            ((shared_ptr<const_Catch::IConfig> *)0x125147);
  ErrnoGuard::~ErrnoGuard((ErrnoGuard *)in_stack_ffffffffffffffa0);
  return local_58;
}

Assistant:

IColourImpl* platformColourInstance() {
        ErrnoGuard guard;
        IConfigPtr config = getCurrentContext().getConfig();
        UseColour::YesOrNo colourMode = config
            ? config->useColour()
            : UseColour::Auto;
        if( colourMode == UseColour::Auto )
            colourMode = useColourOnPlatform()
                ? UseColour::Yes
                : UseColour::No;
        return colourMode == UseColour::Yes
            ? PosixColourImpl::instance()
            : NoColourImpl::instance();
    }